

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void sha512_update_block(void *vctx,uint8_t *inp)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t T2;
  uint64_t T1;
  size_t t;
  uint64_t Wt;
  uint64_t h;
  uint64_t g;
  uint64_t f;
  uint64_t e;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t W [16];
  cf_sha512_context *ctx;
  uint8_t *inp_local;
  void *vctx_local;
  
  b = *vctx;
  c = *(uint64_t *)((long)vctx + 8);
  d = *(uint64_t *)((long)vctx + 0x10);
  e = *(uint64_t *)((long)vctx + 0x18);
  f = *(uint64_t *)((long)vctx + 0x20);
  g = *(uint64_t *)((long)vctx + 0x28);
  h = *(uint64_t *)((long)vctx + 0x30);
  Wt = *(uint64_t *)((long)vctx + 0x38);
  ctx = (cf_sha512_context *)inp;
  for (T1 = 0; T1 < 0x50; T1 = T1 + 1) {
    if (T1 < 0x10) {
      t = read64_be((uint8_t *)ctx);
      W[T1 - 1] = t;
      ctx = (cf_sha512_context *)(ctx->H + 1);
    }
    else {
      uVar4 = rotr64(W[(T1 - 2 & 0xf) - 1],0x13);
      uVar5 = rotr64(W[(T1 - 2 & 0xf) - 1],0x3d);
      uVar7 = W[(T1 - 2 & 0xf) - 1];
      uVar3 = W[(T1 - 7 & 0xf) - 1];
      uVar1 = rotr64(W[(T1 - 0xf & 0xf) - 1],1);
      uVar2 = rotr64(W[(T1 - 0xf & 0xf) - 1],8);
      t = (uVar4 ^ uVar5 ^ uVar7 >> 6) + uVar3 + (uVar1 ^ uVar2 ^ W[(T1 - 0xf & 0xf) - 1] >> 7) +
          W[(T1 - 0x10 & 0xf) - 1];
      W[(T1 & 0xf) - 1] = t;
    }
    uVar3 = rotr64(f,0xe);
    uVar4 = rotr64(f,0x12);
    uVar5 = rotr64(f,0x29);
    lVar6 = Wt + (uVar3 ^ uVar4 ^ uVar5) + (f & g ^ (f ^ 0xffffffffffffffff) & h) + K[T1] + t;
    uVar3 = rotr64(b,0x1c);
    uVar4 = rotr64(b,0x22);
    uVar5 = rotr64(b,0x27);
    uVar7 = b & c;
    uVar8 = b & d;
    uVar9 = c & d;
    Wt = h;
    h = g;
    g = f;
    f = e + lVar6;
    e = d;
    d = c;
    c = b;
    b = lVar6 + (uVar3 ^ uVar4 ^ uVar5) + (uVar7 ^ uVar8 ^ uVar9);
  }
  *(uint64_t *)vctx = b + *vctx;
  *(uint64_t *)((long)vctx + 8) = c + *(long *)((long)vctx + 8);
  *(uint64_t *)((long)vctx + 0x10) = d + *(long *)((long)vctx + 0x10);
  *(uint64_t *)((long)vctx + 0x18) = e + *(long *)((long)vctx + 0x18);
  *(uint64_t *)((long)vctx + 0x20) = f + *(long *)((long)vctx + 0x20);
  *(uint64_t *)((long)vctx + 0x28) = g + *(long *)((long)vctx + 0x28);
  *(uint64_t *)((long)vctx + 0x30) = h + *(long *)((long)vctx + 0x30);
  *(uint64_t *)((long)vctx + 0x38) = Wt + *(long *)((long)vctx + 0x38);
  *(int *)((long)vctx + 0xc0) = *(int *)((long)vctx + 0xc0) + 1;
  return;
}

Assistant:

static void sha512_update_block(void *vctx, const uint8_t *inp)
{
  cf_sha512_context *ctx = vctx;

  uint64_t W[16];

  uint64_t a = ctx->H[0],
           b = ctx->H[1],
           c = ctx->H[2],
           d = ctx->H[3],
           e = ctx->H[4],
           f = ctx->H[5],
           g = ctx->H[6],
           h = ctx->H[7],
           Wt;

  size_t t;
  for (t = 0; t < 80; t++)
  {
    if (t < 16)
    {
      W[t] = Wt = read64_be(inp);
      inp += 8;
    } else {
      Wt = SSIG1(W[(t - 2) % 16]) +
           W[(t - 7) % 16] +
           SSIG0(W[(t - 15) % 16]) +
           W[(t - 16) % 16];
      W[t % 16] = Wt;
    }

    uint64_t T1 = h + BSIG1(e) + CH(e, f, g) + K[t] + Wt;
    uint64_t T2 = BSIG0(a) + MAJ(a, b, c);
    h = g;
    g = f;
    f = e;
    e = d + T1;
    d = c;
    c = b;
    b = a;
    a = T1 + T2;
  }

  ctx->H[0] += a;
  ctx->H[1] += b;
  ctx->H[2] += c;
  ctx->H[3] += d;
  ctx->H[4] += e;
  ctx->H[5] += f;
  ctx->H[6] += g;
  ctx->H[7] += h;

  ctx->blocks++;
}